

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O3

bool qt_PersistentModelIndexLessThan(QPersistentModelIndex *i1,QPersistentModelIndex *i2)

{
  int iVar1;
  strong_ordering sVar2;
  long in_FS_OFFSET;
  bool bVar3;
  undefined8 local_68;
  undefined1 *puStack_60;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_58;
  undefined8 local_48;
  undefined1 *puStack_40;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::parent((QModelIndex *)&local_48,i1);
  local_58.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::parent((QModelIndex *)&local_68,i2);
  bVar3 = SBORROW4((int)local_48,(int)local_68);
  iVar1 = (int)local_48 - (int)local_68;
  if ((int)local_48 == (int)local_68) {
    bVar3 = SBORROW4(local_48._4_4_,local_68._4_4_);
    iVar1 = local_48._4_4_ - local_68._4_4_;
    if (local_48._4_4_ == local_68._4_4_) {
      if ((puStack_40 == puStack_60) && (local_38.ptr == local_58.ptr)) {
        sVar2 = compareThreeWay(i1,i2);
        bVar3 = (bool)((byte)sVar2.m_order >> 7);
      }
      else {
        bVar3 = puStack_40 < puStack_60;
        if (puStack_40 == puStack_60) {
          bVar3 = local_38.ptr < local_58.ptr;
        }
      }
      goto LAB_0045d226;
    }
  }
  bVar3 = bVar3 != iVar1 < 0;
LAB_0045d226:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

static bool qt_PersistentModelIndexLessThan(const QPersistentModelIndex &i1, const QPersistentModelIndex &i2)
{
    const QModelIndex parent1 = i1.parent();
    const QModelIndex parent2 = i2.parent();
    return parent1 == parent2 ? i1 < i2 : parent1 < parent2;
}